

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O0

int Test_SUNLinSolSpace(SUNLinearSolver S,int myid)

{
  uint in_ESI;
  undefined8 in_RDI;
  long leniw;
  long lenrw;
  double stop_time;
  double start_time;
  int failure;
  undefined8 local_38;
  undefined8 local_30;
  double local_28;
  double local_20;
  int local_18;
  uint local_14;
  undefined8 local_10;
  int local_4;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_20 = get_time();
  local_18 = SUNLinSolSpace(local_10,&local_30,&local_38);
  sync_device();
  local_28 = get_time();
  if (local_18 == 0) {
    if ((local_14 == 0) &&
       (printf("    PASSED test -- SUNLinSolSpace, lenrw = %li, leniw = %li\n",local_30,local_38),
       print_time != 0)) {
      printf("    SUNLinSolSpace Time: %22.15e \n \n",local_28 - local_20);
    }
    local_4 = 0;
  }
  else {
    printf(">>> FAILED test -- SUNLinSolSpace, Proc %d \n",(ulong)local_14);
    if (print_time != 0) {
      printf("    SUNLinSolSpace Time: %22.15e \n \n",local_28 - local_20);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Test_SUNLinSolSpace(SUNLinearSolver S, int myid)
{
  int failure;
  double start_time, stop_time;
  long int lenrw, leniw;

  /* call SUNLinSolSpace (failure based on output flag) */
  start_time = get_time();
  failure    = SUNLinSolSpace(S, &lenrw, &leniw);
  sync_device();
  stop_time = get_time();

  if (failure)
  {
    printf(">>> FAILED test -- SUNLinSolSpace, Proc %d \n", myid);
    PRINT_TIME("    SUNLinSolSpace Time: %22.15e \n \n", stop_time - start_time);
    return (1);
  }
  else if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolSpace, lenrw = %li, leniw = %li\n",
           lenrw, leniw);
    PRINT_TIME("    SUNLinSolSpace Time: %22.15e \n \n", stop_time - start_time);
  }

  return (0);
}